

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.h
# Opt level: O0

void __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::TimeZoneInfo(TimeZoneInfo *this)

{
  TimeZoneInfo *this_local;
  
  TimeZoneIf::TimeZoneIf(&this->super_TimeZoneIf);
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)&PTR__TimeZoneInfo_0082dfd0;
  std::
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  ::vector(&this->transitions_);
  std::
  vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  ::vector(&this->transition_types_);
  std::__cxx11::string::string((string *)&this->abbreviations_);
  std::__cxx11::string::string((string *)&this->version_);
  std::__cxx11::string::string((string *)&this->future_spec_);
  memset(&this->local_time_hint_,0,8);
  memset(&this->time_local_hint_,0,8);
  return;
}

Assistant:

TimeZoneInfo() = default;